

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O0

char * p2sc_timestamp(double t,int prec)

{
  tm *ptVar1;
  char *pcVar2;
  double in_XMM0_Qa;
  double tt [6];
  tm *tm;
  time_t s;
  double f;
  double i;
  timeval tv;
  undefined8 in_stack_ffffffffffffffb0;
  int d;
  double in_stack_ffffffffffffffb8;
  long local_38;
  double local_30;
  double local_28;
  timeval local_20;
  double local_8;
  
  d = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = in_XMM0_Qa;
  if (in_XMM0_Qa < 0.0) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    local_8 = (double)local_20.tv_sec + (double)local_20.tv_usec / 1000000.0;
  }
  local_30 = modf(local_8,&local_28);
  local_38 = (long)local_28;
  local_30 = p2sc_round(in_stack_ffffffffffffffb8,d);
  if (1.0 <= local_30) {
    local_38 = local_38 + 1;
    local_30 = 0.0;
  }
  ptVar1 = gmtime(&local_38);
  if (ptVar1 == (tm *)0x0) {
    _p2sc_msg((char *)(double)local_38,"p2sc_timestamp",0x26d8d6,(char *)0x8b,0x26d970,(char *)0xfa0
              ,"gmtime(%f)");
    exit(1);
  }
  pcVar2 = p2sc_date2string((double *)0x10c70d);
  return pcVar2;
}

Assistant:

char *p2sc_timestamp(double t, int prec) {
    if (t < 0) {
        struct timeval tv;
        gettimeofday(&tv, NULL);
        t = tv.tv_sec + tv.tv_usec / 1000000.;
        // t = g_get_real_time() / 1000000.; for glib-2.0>=2.28
    }

    double i, f = modf(t, &i);
    time_t s = i;

    f = p2sc_round(f, prec);
    if (f >= 1) {
        ++s;
        f = 0;
    }

    struct tm *tm = gmtime(&s);
    if (!tm)
        P2SC_Msg(LVL_FATAL, "gmtime(%f)", (double) s);

    double tt[6] = {
        tm->tm_year + 1900, tm->tm_mon + 1, tm->tm_mday,
        tm->tm_hour, tm->tm_min, tm->tm_sec + f
    };

    return p2sc_date2string(tt);
}